

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.upb.h
# Opt level: O0

void upb_test_TestExtensions_set_optional_int32_ext
               (upb_test_TestExtensions *msg,int32_t val,upb_Arena *arena)

{
  bool bVar1;
  upb_FieldRep uVar2;
  bool ok;
  upb_MiniTableExtension *ext;
  upb_Arena *arena_local;
  upb_test_TestExtensions *puStack_10;
  int32_t val_local;
  upb_test_TestExtensions *msg_local;
  
  arena_local._4_4_ = val;
  puStack_10 = msg;
  bVar1 = upb_MiniTableField_IsScalar
                    (&upb_test_TestExtensions_optional_int32_ext_ext.
                      field_dont_copy_me__upb_internal_use_only);
  if (!bVar1) {
    __assert_fail("upb_MiniTableField_IsScalar(&ext->field_dont_copy_me__upb_internal_use_only)",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/upb/message/test.upb.h"
                  ,0xcf6,
                  "void upb_test_TestExtensions_set_optional_int32_ext(struct upb_test_TestExtensions *, int32_t, upb_Arena *)"
                 );
  }
  uVar2 = _upb_MiniTableField_GetRep_dont_copy_me__upb_internal_use_only
                    (&upb_test_TestExtensions_optional_int32_ext_ext.
                      field_dont_copy_me__upb_internal_use_only);
  if (uVar2 == kUpb_FieldRep_4Byte) {
    bVar1 = upb_Message_SetExtension
                      (&puStack_10->base_dont_copy_me__upb_internal_use_only,
                       &upb_test_TestExtensions_optional_int32_ext_ext,
                       (void *)((long)&arena_local + 4),arena);
    if (bVar1) {
      return;
    }
    __assert_fail("ok",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/upb/message/test.upb.h"
                  ,0xcfa,
                  "void upb_test_TestExtensions_set_optional_int32_ext(struct upb_test_TestExtensions *, int32_t, upb_Arena *)"
                 );
  }
  __assert_fail("_upb_MiniTableField_GetRep_dont_copy_me__upb_internal_use_only( &ext->field_dont_copy_me__upb_internal_use_only) == kUpb_FieldRep_4Byte"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/upb/message/test.upb.h"
                ,0xcf8,
                "void upb_test_TestExtensions_set_optional_int32_ext(struct upb_test_TestExtensions *, int32_t, upb_Arena *)"
               );
}

Assistant:

UPB_INLINE void upb_test_TestExtensions_set_optional_int32_ext(struct upb_test_TestExtensions* msg, int32_t val, upb_Arena* arena) {
  const upb_MiniTableExtension* ext = &upb_test_TestExtensions_optional_int32_ext_ext;
  UPB_ASSUME(upb_MiniTableField_IsScalar(&ext->UPB_PRIVATE(field)));
  UPB_ASSUME(UPB_PRIVATE(_upb_MiniTableField_GetRep)(
                 &ext->UPB_PRIVATE(field)) == kUpb_FieldRep_4Byte);
  bool ok = upb_Message_SetExtension((upb_Message*)msg, ext, &val, arena);
  UPB_ASSERT(ok);
}